

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

void spvc_convert_msl_sampler(MSLConstexprSampler *samp,spvc_msl_constexpr_sampler *sampler)

{
  spvc_msl_constexpr_sampler *sampler_local;
  MSLConstexprSampler *samp_local;
  
  samp->s_address = sampler->s_address;
  samp->t_address = sampler->t_address;
  samp->r_address = sampler->r_address;
  samp->lod_clamp_min = sampler->lod_clamp_min;
  samp->lod_clamp_max = sampler->lod_clamp_max;
  samp->lod_clamp_enable = sampler->lod_clamp_enable != '\0';
  samp->min_filter = sampler->min_filter;
  samp->mag_filter = sampler->mag_filter;
  samp->mip_filter = sampler->mip_filter;
  samp->compare_enable = sampler->compare_enable != '\0';
  samp->anisotropy_enable = sampler->anisotropy_enable != '\0';
  samp->max_anisotropy = sampler->max_anisotropy;
  samp->compare_func = sampler->compare_func;
  samp->coord = sampler->coord;
  samp->border_color = sampler->border_color;
  return;
}

Assistant:

static void spvc_convert_msl_sampler(MSLConstexprSampler &samp, const spvc_msl_constexpr_sampler *sampler)
{
	samp.s_address = static_cast<MSLSamplerAddress>(sampler->s_address);
	samp.t_address = static_cast<MSLSamplerAddress>(sampler->t_address);
	samp.r_address = static_cast<MSLSamplerAddress>(sampler->r_address);
	samp.lod_clamp_min = sampler->lod_clamp_min;
	samp.lod_clamp_max = sampler->lod_clamp_max;
	samp.lod_clamp_enable = sampler->lod_clamp_enable != 0;
	samp.min_filter = static_cast<MSLSamplerFilter>(sampler->min_filter);
	samp.mag_filter = static_cast<MSLSamplerFilter>(sampler->mag_filter);
	samp.mip_filter = static_cast<MSLSamplerMipFilter>(sampler->mip_filter);
	samp.compare_enable = sampler->compare_enable != 0;
	samp.anisotropy_enable = sampler->anisotropy_enable != 0;
	samp.max_anisotropy = sampler->max_anisotropy;
	samp.compare_func = static_cast<MSLSamplerCompareFunc>(sampler->compare_func);
	samp.coord = static_cast<MSLSamplerCoord>(sampler->coord);
	samp.border_color = static_cast<MSLSamplerBorderColor>(sampler->border_color);
}